

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MemPool.cpp
# Opt level: O2

void amrex_mempool_get_stats(int *mp_min,int *mp_max,int *mp_tot)

{
  undefined8 *puVar1;
  size_t sVar2;
  unique_ptr<amrex::CArena,_std::default_delete<amrex::CArena>_> *mp;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  puVar1 = DAT_006e1200;
  uVar4 = 0xffffffffffffffff;
  uVar5 = 0;
  uVar6 = 0;
  for (puVar3 = (anonymous_namespace)::the_memory_pool; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    sVar2 = amrex::CArena::heap_space_used((CArena *)*puVar3);
    if (sVar2 <= uVar4) {
      uVar4 = sVar2;
    }
    if (uVar5 < sVar2) {
      uVar5 = sVar2;
    }
    uVar6 = uVar6 + sVar2;
  }
  *mp_min = (int)(uVar4 >> 0x14);
  *mp_max = (int)(uVar5 >> 0x14);
  *mp_tot = (int)(uVar6 >> 0x14);
  return;
}

Assistant:

void amrex_mempool_get_stats (int& mp_min, int& mp_max, int& mp_tot) // min, max & tot in MB
{
  size_t hsu_min=std::numeric_limits<size_t>::max();
  size_t hsu_max=0;
  size_t hsu_tot=0;
  for (const auto& mp : the_memory_pool) {
    size_t hsu = mp->heap_space_used();
    hsu_min = std::min(hsu, hsu_min);
    hsu_max = std::max(hsu, hsu_max);
    hsu_tot += hsu;
  }
  mp_min = hsu_min/(1024*1024);
  mp_max = hsu_max/(1024*1024);
  mp_tot = hsu_tot/(1024*1024);
}